

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::msgpack::
basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::parse
          (basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
          ,item_event_visitor *visitor,error_code *ec)

{
  pointer *pppVar1;
  pointer ppVar2;
  pointer ppVar3;
  assertion_error *this_00;
  string local_40;
  
  if (this->done_ == false) {
    do {
      if (this->more_ != true) {
        return;
      }
      ppVar2 = (this->state_stack_).
               super__Vector_base<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      switch(ppVar2[-1].mode) {
      case root:
        ppVar2[-1].mode = accept;
        goto LAB_001f3bfe;
      case accept:
        ppVar3 = (this->state_stack_).
                 super__Vector_base<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)ppVar2 - (long)ppVar3 != 0x18) {
          this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"assertion \'state_stack_.size() == 1\' failed at  <> :0",
                     "");
          assertion_error::assertion_error(this_00,&local_40);
          __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (ppVar2 != ppVar3) {
          (this->state_stack_).
          super__Vector_base<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
        }
        this->more_ = false;
        this->done_ = true;
        (*visitor->_vptr_basic_item_event_visitor[2])(visitor);
        break;
      case array:
        if (ppVar2[-1].index < ppVar2[-1].length) {
          ppVar2[-1].index = ppVar2[-1].index + 1;
          goto LAB_001f3bfe;
        }
        this->nesting_depth_ = this->nesting_depth_ + -1;
        (*visitor->_vptr_basic_item_event_visitor[8])(visitor,this,ec);
LAB_001f3c6c:
        this->more_ = (bool)(this->cursor_mode_ ^ 1);
        pppVar1 = &(this->state_stack_).
                   super__Vector_base<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + -1;
        break;
      case map_key:
        if (ppVar2[-1].length <= ppVar2[-1].index) {
          this->nesting_depth_ = this->nesting_depth_ + -1;
          (*visitor->_vptr_basic_item_event_visitor[5])(visitor,this,ec);
          goto LAB_001f3c6c;
        }
        ppVar2[-1].index = ppVar2[-1].index + 1;
        ppVar2[-1].mode = map_value;
        goto LAB_001f3bfe;
      case map_value:
        ppVar2[-1].mode = map_key;
LAB_001f3bfe:
        read_item(this,visitor,ec);
        if (ec->_M_value != 0) {
          return;
        }
      }
    } while (this->done_ != true);
  }
  return;
}

Assistant:

void parse(item_event_visitor& visitor, std::error_code& ec)
    {
        while (!done_ && more_)
        {
            switch (state_stack_.back().mode)
            {
                case parse_mode::array:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_item(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        end_array(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_key:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        state_stack_.back().mode = parse_mode::map_value;
                        read_item(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        end_object(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_value:
                {
                    state_stack_.back().mode = parse_mode::map_key;
                    read_item(visitor, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::root:
                {
                    state_stack_.back().mode = parse_mode::accept;
                    read_item(visitor, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::accept:
                {
                    JSONCONS_ASSERT(state_stack_.size() == 1);
                    state_stack_.clear();
                    more_ = false;
                    done_ = true;
                    visitor.flush();
                    break;
                }
            }
        }
    }